

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_uuid.c
# Opt level: O0

ssize_t read_all(int fd,char *buf,size_t count)

{
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  ssize_t local_48;
  int local_3c;
  long lStack_38;
  int tries;
  ssize_t c;
  ssize_t ret;
  size_t count_local;
  char *buf_local;
  int fd_local;
  
  lStack_38 = 0;
  local_3c = 0;
  memset(buf,0,count);
  ret = count;
  count_local = (size_t)buf;
  do {
    while( true ) {
      if (ret == 0) {
        return lStack_38;
      }
      sVar2 = read(fd,(void *)count_local,ret);
      if (sVar2 < 1) break;
      if (0 < sVar2) {
        local_3c = 0;
      }
      ret = ret - sVar2;
      count_local = sVar2 + count_local;
      lStack_38 = sVar2 + lStack_38;
    }
    piVar3 = __errno_location();
  } while ((((*piVar3 == 0xb) || (piVar3 = __errno_location(), *piVar3 == 4)) || (sVar2 == 0)) &&
          (bVar1 = local_3c < 5, local_3c = local_3c + 1, bVar1));
  if (lStack_38 == 0) {
    local_48 = -1;
  }
  else {
    local_48 = lStack_38;
  }
  return local_48;
}

Assistant:

static ssize_t read_all(int fd, char *buf, size_t count)
{
	ssize_t ret;
	ssize_t c = 0;
	int tries = 0;

	memset(buf, 0, count);
	while (count > 0) {
		ret = read(fd, buf, count);
		if (ret <= 0) {
			if ((errno == EAGAIN || errno == EINTR || ret == 0) &&
			    (tries++ < 5))
				continue;
			return c ? c : -1;
		}
		if (ret > 0)
			tries = 0;
		count -= ret;
		buf += ret;
		c += ret;
	}
	return c;
}